

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::WriteNode
          (cmGraphVizWriter *this,string *targetName,cmGeneratorTarget *target,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,cmGeneratedFileStream *str)

{
  TargetType TVar1;
  iterator iVar2;
  const_iterator cVar3;
  ostream *poVar4;
  size_t sVar5;
  char *__s;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&insertedNodes->_M_t,targetName);
  if ((_Rb_tree_header *)iVar2._M_node != &(insertedNodes->_M_t)._M_impl.super__Rb_tree_header) {
    return;
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)insertedNodes,targetName);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->TargetNamesNodes)._M_t,targetName);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,"    \"",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)str,*(char **)(cVar3._M_node + 2),(long)cVar3._M_node[2]._M_parent)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" [ label=\"",0xb);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(targetName->_M_dataplus)._M_p,targetName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" shape=\"",9);
  if (target == (cmGeneratorTarget *)0x0) {
    __s = "ellipse";
  }
  else {
    TVar1 = cmGeneratorTarget::GetType(target);
    if (TVar1 < OBJECT_LIBRARY) {
      __s = &DAT_005dda70 + *(int *)(&DAT_005dda70 + (ulong)TVar1 * 4);
    }
    else {
      __s = "box";
    }
  }
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"];",3);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void cmGraphVizWriter::WriteNode(const std::string& targetName,
                                 const cmGeneratorTarget* target,
                                 std::set<std::string>& insertedNodes,
                                 cmGeneratedFileStream& str) const
{
  if (insertedNodes.find(targetName) == insertedNodes.end()) {
    insertedNodes.insert(targetName);
    std::map<std::string, std::string>::const_iterator nameIt =
      this->TargetNamesNodes.find(targetName);

    str << "    \"" << nameIt->second << "\" [ label=\"" << targetName
        << "\" shape=\"" << getShapeForTarget(target) << "\"];" << std::endl;
  }
}